

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O0

void __thiscall
MakefileGenerator::writeMakeQmake(MakefileGenerator *this,QTextStream *t,bool noDummyQmakeAll)

{
  bool bVar1;
  byte bVar2;
  QTextStream *pQVar3;
  QStringBuilder<QStringBuilder<QString,_QString_&>,_const_char_(&)[11]> *sep;
  long lVar4;
  qsizetype qVar5;
  const_reference this_00;
  QTextStream *pQVar6;
  byte in_DL;
  QTextStream *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  ProString *i;
  int include;
  ProStringList *extraCommands;
  ProStringList *included;
  QString qmake;
  QStringList files;
  QString ofile;
  QMakeProject *in_stack_fffffffffffff968;
  QTextStreamFunction f;
  undefined7 in_stack_fffffffffffff970;
  undefined1 in_stack_fffffffffffff977;
  QMakeProject *in_stack_fffffffffffff978;
  QStringBuilder<QStringBuilder<QString,_QString_&>,_const_char_(&)[11]> *in_stack_fffffffffffff980;
  QMakeProject *in_stack_fffffffffffff988;
  MakefileGenerator *in_stack_fffffffffffff990;
  MakefileGenerator *this_01;
  MakefileGenerator *in_stack_fffffffffffff998;
  undefined1 withExtra;
  ProString *str;
  MakefileGenerator *in_stack_fffffffffffff9a0;
  char *in_stack_fffffffffffff9a8;
  char *ch;
  MakefileGenerator *in_stack_fffffffffffff9b0;
  undefined8 in_stack_fffffffffffff9c8;
  QFlagsStorage<MakefileGenerator::FileFixifyType> fix;
  byte local_5f1;
  undefined8 in_stack_fffffffffffffa10;
  undefined1 canon;
  QTextStream *in_stack_fffffffffffffa18;
  MakefileGenerator *in_stack_fffffffffffffa20;
  byte local_5a9;
  int local_59c;
  undefined1 local_4f8 [96];
  undefined1 local_498 [72];
  ProString local_450 [2];
  undefined1 local_3d8 [184];
  undefined1 local_320 [24];
  undefined1 local_308 [80];
  undefined1 local_2b8 [24];
  undefined1 local_2a0 [80];
  undefined1 local_250 [24];
  undefined1 local_238 [24];
  undefined1 local_220 [104];
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined1 local_1a0 [30];
  QChar local_182;
  undefined1 local_180 [76];
  QFlagsStorage<MakefileGenerator::FileFixifyType> in_stack_fffffffffffffecc;
  undefined1 local_108 [24];
  undefined1 local_f0 [56];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  canon = (undefined1)((ulong)in_stack_fffffffffffffa10 >> 0x38);
  fix.i = (Int)((ulong)in_stack_fffffffffffff9c8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QFile::fileName();
  QFlags<MakefileGenerator::FileFixifyType>::QFlags
            ((QFlags<MakefileGenerator::FileFixifyType> *)
             CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
             (FileFixifyType)((ulong)in_stack_fffffffffffff968 >> 0x20));
  fileFixify(in_stack_fffffffffffffa20,(QString *)in_stack_fffffffffffffa18,
             (FileFixifyTypes)in_stack_fffffffffffffecc.i,(bool)canon);
  QString::~QString((QString *)0x196a5e);
  ProKey::ProKey((ProKey *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
                 (char *)in_stack_fffffffffffff968);
  bVar1 = QMakeProject::isEmpty(in_stack_fffffffffffff988,(ProKey *)in_stack_fffffffffffff980);
  local_5a9 = 0;
  if (bVar1) {
    ProKey::ProKey((ProKey *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
                   (char *)in_stack_fffffffffffff968);
    bVar1 = QMakeProject::isEmpty(in_stack_fffffffffffff988,(ProKey *)in_stack_fffffffffffff980);
    local_5a9 = bVar1 ^ 0xff;
    ProKey::~ProKey((ProKey *)0x196b30);
  }
  ProKey::~ProKey((ProKey *)0x196b3d);
  if ((local_5a9 & 1) != 0) {
    local_b8 = 0xaaaaaaaaaaaaaaaa;
    local_b0 = 0xaaaaaaaaaaaaaaaa;
    local_a8 = 0xaaaaaaaaaaaaaaaa;
    QFlags<MakefileGenerator::FileFixifyType>::QFlags
              ((QFlags<MakefileGenerator::FileFixifyType> *)
               CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
               (FileFixifyType)((ulong)in_stack_fffffffffffff968 >> 0x20));
    fileFixify(in_stack_fffffffffffff990,(QStringList *)in_stack_fffffffffffff988,
               (FileFixifyTypes)fix.i,SUB81((ulong)in_stack_fffffffffffff980 >> 0x38,0));
    escapeFilePaths(in_stack_fffffffffffff998,(QStringList *)in_stack_fffffffffffff990);
    withExtra = (undefined1)((ulong)in_stack_fffffffffffff998 >> 0x38);
    QList<QString>::~QList((QList<QString> *)0x196bdc);
    canon = (undefined1)((ulong)in_RDI[0x1b] >> 0x38);
    in_stack_fffffffffffffa18 = in_RSI;
    ProKey::ProKey((ProKey *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
                   (char *)in_stack_fffffffffffff968);
    QMakeEvaluator::first
              (&in_stack_fffffffffffff988->super_QMakeEvaluator,(ProKey *)in_stack_fffffffffffff980)
    ;
    ProString::toQString((ProString *)in_stack_fffffffffffff968);
    (**(code **)(*in_RDI + 0x68))(local_f0,in_RDI,local_108);
    pQVar6 = (QTextStream *)QTextStream::operator<<(in_stack_fffffffffffffa18,(QString *)local_f0);
    pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,": \n\t");
    in_stack_fffffffffffffa20 =
         (MakefileGenerator *)QTextStream::operator<<(pQVar6,"@$(QMAKE) -prl ");
    QChar::QChar<char,_true>(&local_182,' ');
    QListSpecialMethods<QString>::join
              ((QListSpecialMethods<QString> *)in_stack_fffffffffffff978,
               (QChar)(char16_t)((ulong)in_stack_fffffffffffff988 >> 0x30));
    pQVar6 = (QTextStream *)
             QTextStream::operator<<((QTextStream *)in_stack_fffffffffffffa20,(QString *)local_180);
    pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,' ');
    buildArgs(in_stack_fffffffffffff9a0,(bool)withExtra);
    QTextStream::operator<<(pQVar6,(QString *)local_1a0);
    ::operator<<((QTextStream *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
                 (QTextStreamFunction)in_stack_fffffffffffff968);
    QString::~QString((QString *)0x196d46);
    QString::~QString((QString *)0x196d53);
    QString::~QString((QString *)0x196d60);
    QString::~QString((QString *)0x196d6d);
    ProString::~ProString((ProString *)0x196d7a);
    ProKey::~ProKey((ProKey *)0x196d87);
    QList<QString>::~QList((QList<QString> *)0x196d94);
  }
  local_1b8 = 0xaaaaaaaaaaaaaaaa;
  local_1b0 = 0xaaaaaaaaaaaaaaaa;
  local_1a8 = 0xaaaaaaaaaaaaaaaa;
  fullBuildArgs(in_stack_fffffffffffff9b0);
  ::operator+((char (*) [9])in_stack_fffffffffffff978,
              (QString *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970));
  ::QStringBuilder::operator_cast_to_QString
            ((QStringBuilder<const_char_(&)[9],_QString> *)in_stack_fffffffffffff968);
  QStringBuilder<const_char_(&)[9],_QString>::~QStringBuilder
            ((QStringBuilder<const_char_(&)[9],_QString> *)0x196e14);
  QString::~QString((QString *)0x196e21);
  bVar1 = QString::isEmpty((QString *)0x196e2e);
  local_5f1 = 0;
  if (!bVar1) {
    QString::QString((QString *)in_stack_fffffffffffff978,in_stack_fffffffffffff9a8);
    bVar1 = QMakeProject::isActiveConfig
                      (in_stack_fffffffffffff978,
                       (QString *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
                       SUB81((ulong)in_stack_fffffffffffff968 >> 0x38,0));
    local_5f1 = bVar1 ^ 0xff;
    QString::~QString((QString *)0x196ec0);
  }
  if ((local_5f1 & 1) != 0) {
    (**(code **)(*in_RDI + 0x68))(local_220,in_RDI,&local_20);
    pQVar6 = (QTextStream *)QTextStream::operator<<(in_RSI,(QString *)local_220);
    pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,": ");
    QMakeProject::projectFile(in_stack_fffffffffffff968);
    QFlags<MakefileGenerator::FileFixifyType>::QFlags
              ((QFlags<MakefileGenerator::FileFixifyType> *)
               CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
               (FileFixifyType)((ulong)in_stack_fffffffffffff968 >> 0x20));
    fileFixify(in_stack_fffffffffffffa20,(QString *)in_stack_fffffffffffffa18,
               (FileFixifyTypes)in_stack_fffffffffffffecc.i,(bool)canon);
    (**(code **)(*in_RDI + 0x68))(local_238,in_RDI,local_250);
    pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)local_238);
    QTextStream::operator<<(pQVar6," ");
    QString::~QString((QString *)0x196fd1);
    QString::~QString((QString *)0x196fde);
    QString::~QString((QString *)0x196feb);
    QString::~QString((QString *)0x196ff8);
    if ((Option::globals->do_cache & 1U) != 0) {
      QMakeProject::confFile(in_stack_fffffffffffff968);
      bVar1 = QString::isEmpty((QString *)0x197034);
      QString::~QString((QString *)0x197047);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        QMakeProject::confFile(in_stack_fffffffffffff968);
        QFlags<MakefileGenerator::FileFixifyType>::QFlags
                  ((QFlags<MakefileGenerator::FileFixifyType> *)
                   CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
                   (FileFixifyType)((ulong)in_stack_fffffffffffff968 >> 0x20));
        fileFixify(in_stack_fffffffffffffa20,(QString *)in_stack_fffffffffffffa18,
                   (FileFixifyTypes)in_stack_fffffffffffffecc.i,(bool)canon);
        (**(code **)(*in_RDI + 0x68))(local_2a0,in_RDI,local_2b8);
        pQVar6 = (QTextStream *)QTextStream::operator<<(in_RSI,(QString *)local_2a0);
        QTextStream::operator<<(pQVar6," ");
        QString::~QString((QString *)0x197102);
        QString::~QString((QString *)0x19710f);
        QString::~QString((QString *)0x19711c);
      }
      QMakeProject::cacheFile(in_stack_fffffffffffff968);
      bVar1 = QString::isEmpty((QString *)0x197145);
      QString::~QString((QString *)0x197158);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        pQVar6 = in_RSI;
        QMakeProject::cacheFile(in_stack_fffffffffffff968);
        QFlags<MakefileGenerator::FileFixifyType>::QFlags
                  ((QFlags<MakefileGenerator::FileFixifyType> *)
                   CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
                   (FileFixifyType)((ulong)in_stack_fffffffffffff968 >> 0x20));
        fileFixify(in_stack_fffffffffffffa20,(QString *)in_stack_fffffffffffffa18,
                   (FileFixifyTypes)in_stack_fffffffffffffecc.i,(bool)canon);
        (**(code **)(*in_RDI + 0x68))(local_308,in_RDI,local_320);
        pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)local_308);
        QTextStream::operator<<(pQVar6," ");
        QString::~QString((QString *)0x197213);
        QString::~QString((QString *)0x197220);
        QString::~QString((QString *)0x19722d);
      }
    }
    specdir((MakefileGenerator *)in_stack_fffffffffffff978);
    bVar1 = QString::isEmpty((QString *)0x197251);
    QString::~QString((QString *)0x197264);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      specdir((MakefileGenerator *)in_stack_fffffffffffff978);
      ::operator+((QString *)in_stack_fffffffffffff978,
                  (char (*) [12])CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970));
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QString,_const_char_(&)[12]> *)in_stack_fffffffffffff968);
      Option::normalizePath
                ((QString *)in_stack_fffffffffffff988,
                 SUB81((ulong)in_stack_fffffffffffff980 >> 0x38,0),
                 SUB81((ulong)in_stack_fffffffffffff980 >> 0x30,0));
      bVar1 = exists((MakefileGenerator *)in_stack_fffffffffffff988,
                     (QString *)in_stack_fffffffffffff980);
      QString::~QString((QString *)0x1972f9);
      QString::~QString((QString *)0x197306);
      QStringBuilder<QString,_const_char_(&)[12]>::~QStringBuilder
                ((QStringBuilder<QString,_const_char_(&)[12]> *)0x197313);
      QString::~QString((QString *)0x197320);
      if (bVar1) {
        specdir((MakefileGenerator *)in_stack_fffffffffffff978);
        ::operator+((QString *)in_stack_fffffffffffff978,
                    (QString *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970));
        ::operator+((QStringBuilder<QString,_QString_&> *)in_stack_fffffffffffff978,
                    (char (*) [11])CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970));
        escapeDependencyPath<QStringBuilder<QString,QString&>,char_const(&)[11]>
                  ((MakefileGenerator *)in_stack_fffffffffffff988,in_stack_fffffffffffff980);
        pQVar6 = (QTextStream *)QTextStream::operator<<(in_RSI,(QString *)local_3d8);
        QTextStream::operator<<(pQVar6," ");
        QString::~QString((QString *)0x1973d2);
        QStringBuilder<QStringBuilder<QString,_QString_&>,_const_char_(&)[11]>::~QStringBuilder
                  ((QStringBuilder<QStringBuilder<QString,_QString_&>,_const_char_(&)[11]> *)
                   0x1973df);
        QStringBuilder<QString,_QString_&>::~QStringBuilder
                  ((QStringBuilder<QString,_QString_&> *)0x1973ec);
        QString::~QString((QString *)0x1973f9);
      }
    }
    this_01 = (MakefileGenerator *)in_RDI[0x1b];
    ProKey::ProKey((ProKey *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
                   (char *)in_stack_fffffffffffff968);
    QMakeProject::values
              ((QMakeProject *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
               (ProKey *)in_stack_fffffffffffff968);
    escapeDependencyPaths(this_01,(ProStringList *)in_stack_fffffffffffff988);
    ProKey::~ProKey((ProKey *)0x19746c);
    str = local_450;
    pQVar6 = in_RSI;
    QString::QString((QString *)in_stack_fffffffffffff978,in_stack_fffffffffffff9a8);
    ProStringList::join((ProStringList *)in_stack_fffffffffffff988,
                        (QString *)in_stack_fffffffffffff980);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)local_498);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,"\n\t");
    QTextStream::operator<<(pQVar3,(QString *)&local_1b8);
    ::operator<<((QTextStream *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
                 (QTextStreamFunction)in_stack_fffffffffffff968);
    QString::~QString((QString *)0x197511);
    QString::~QString((QString *)0x19751e);
    ch = (char *)in_RDI[0x1b];
    ProKey::ProKey((ProKey *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
                   (char *)in_stack_fffffffffffff968);
    sep = (QStringBuilder<QStringBuilder<QString,_QString_&>,_const_char_(&)[11]> *)
          QMakeProject::values
                    ((QMakeProject *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
                     (ProKey *)in_stack_fffffffffffff968);
    ProKey::~ProKey((ProKey *)0x19757c);
    bVar1 = QList<ProString>::isEmpty((QList<ProString> *)0x197596);
    if (!bVar1) {
      in_stack_fffffffffffff988 = (QMakeProject *)QTextStream::operator<<(in_RSI,"\t");
      QString::QString((QString *)in_stack_fffffffffffff978,ch);
      ProStringList::join((ProStringList *)in_stack_fffffffffffff988,(QString *)sep);
      QTextStream::operator<<((QTextStream *)in_stack_fffffffffffff988,(QString *)local_4f8);
      ::operator<<((QTextStream *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
                   (QTextStreamFunction)in_stack_fffffffffffff968);
      QString::~QString((QString *)0x197620);
      QString::~QString((QString *)0x19762d);
      in_stack_fffffffffffff980 = sep;
    }
    local_59c = 0;
    while( true ) {
      lVar4 = (long)local_59c;
      qVar5 = QList<ProString>::size((QList<ProString> *)local_450);
      if (qVar5 <= lVar4) break;
      this_00 = QList<ProString>::at
                          ((QList<ProString> *)
                           CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
                           (qsizetype)in_stack_fffffffffffff968);
      bVar1 = ProString::isEmpty(this_00);
      if (!bVar1) {
        pQVar3 = ::operator<<(pQVar6,str);
        QTextStream::operator<<(pQVar3,":\n");
      }
      local_59c = local_59c + 1;
    }
    ProStringList::~ProStringList((ProStringList *)0x1976e8);
  }
  f = (QTextStreamFunction)in_RDI[0x1b];
  ProKey::ProKey((ProKey *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),(char *)f);
  QMakeEvaluator::first
            (&in_stack_fffffffffffff988->super_QMakeEvaluator,(ProKey *)in_stack_fffffffffffff980);
  bVar2 = ProString::operator!=
                    ((ProString *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
                     (char *)f);
  ProString::~ProString((ProString *)0x19774d);
  ProKey::~ProKey((ProKey *)0x19775a);
  if ((bVar2 & 1) != 0) {
    pQVar6 = (QTextStream *)QTextStream::operator<<(in_RSI,"qmake: FORCE\n\t@");
    QTextStream::operator<<(pQVar6,(QString *)&local_1b8);
    ::operator<<((QTextStream *)CONCAT17(bVar2,in_stack_fffffffffffff970),f);
    ::operator<<((QTextStream *)CONCAT17(bVar2,in_stack_fffffffffffff970),f);
    if ((in_DL & 1) == 0) {
      QTextStream::operator<<(in_RSI,"qmake_all: FORCE\n\n");
    }
  }
  QString::~QString((QString *)0x1977d3);
  QString::~QString((QString *)0x1977e0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void
MakefileGenerator::writeMakeQmake(QTextStream &t, bool noDummyQmakeAll)
{
    QString ofile = fileFixify(Option::output.fileName());
    if(project->isEmpty("QMAKE_FAILED_REQUIREMENTS") && !project->isEmpty("QMAKE_INTERNAL_PRL_FILE")) {
        QStringList files = escapeFilePaths(fileFixify(Option::mkfile::project_files));
        t << escapeDependencyPath(project->first("QMAKE_INTERNAL_PRL_FILE").toQString()) << ": \n\t"
          << "@$(QMAKE) -prl " << files.join(' ') << ' ' << buildArgs(true) << Qt::endl;
    }

        QString qmake = "$(QMAKE)" + fullBuildArgs();
        if(!ofile.isEmpty() && !project->isActiveConfig("no_autoqmake")) {
            t << escapeDependencyPath(ofile) << ": "
              << escapeDependencyPath(fileFixify(project->projectFile())) << " ";
            if (Option::globals->do_cache) {
                if (!project->confFile().isEmpty())
                    t <<  escapeDependencyPath(fileFixify(project->confFile())) << " ";
                if (!project->cacheFile().isEmpty())
                    t <<  escapeDependencyPath(fileFixify(project->cacheFile())) << " ";
            }
            if(!specdir().isEmpty()) {
                if (exists(Option::normalizePath(specdir() + "/qmake.conf")))
                    t << escapeDependencyPath(specdir() + Option::dir_sep + "qmake.conf") << " ";
            }
            const ProStringList &included = escapeDependencyPaths(project->values("QMAKE_INTERNAL_INCLUDED_FILES"));
            t << included.join(QString(" \\\n\t\t")) << "\n\t"
              << qmake << Qt::endl;
            const ProStringList &extraCommands = project->values("QMAKE_MAKE_QMAKE_EXTRA_COMMANDS");
            if (!extraCommands.isEmpty())
                t << "\t" << extraCommands.join(QString("\n\t")) << Qt::endl;
            for(int include = 0; include < included.size(); ++include) {
                const ProString &i = included.at(include);
                if(!i.isEmpty())
                    t << i << ":\n";
            }
        }
        if(project->first("QMAKE_ORIG_TARGET") != "qmake") {
            t << "qmake: FORCE\n\t@" << qmake << Qt::endl << Qt::endl;
            if (!noDummyQmakeAll)
                t << "qmake_all: FORCE\n\n";
        }
}